

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall
Gecko::Graph::order(Graph *this,Functional *functional,uint iterations,uint window,uint period,
                   uint seed,Progress *progress)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  float fVar1;
  pointer pNVar2;
  pointer puVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  Float FVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> minperm;
  float local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  this->functional = functional;
  if (progress == (Progress *)0x0) {
    progress = (Progress *)operator_new(8);
    progress->_vptr_Progress = (_func_int **)&PTR__Progress_00110d48;
  }
  this->progress = progress;
  pNVar2 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0xffffffff;
  do {
    uVar5 = uVar5 + 1;
  } while ((uint)(1 << ((byte)uVar5 & 0x1f)) <
           (int)((ulong)((long)(this->node).
                               super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl
                               .super__Vector_impl_data._M_finish - (long)pNVar2) >> 4) - 1U);
  this->level = uVar5;
  __x = &this->perm;
  puVar3 = (this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((long)(this->perm).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2);
  if (iVar4 != 0) {
    fVar9 = 0.0;
    lVar6 = 0;
    do {
      uVar7 = puVar3[lVar6];
      fVar1 = pNVar2[uVar7].hlen;
      fVar9 = fVar9 + fVar1;
      pNVar2[uVar7].pos = fVar9;
      fVar9 = fVar9 + fVar1;
      lVar6 = lVar6 + 1;
    } while (iVar4 != (int)lVar6);
  }
  local_54 = cost(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__x);
  if (seed != 0) {
    shuffle(this,seed);
  }
  (*progress->_vptr_Progress[2])(local_54,progress,this);
  if ((((ulong)((long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff & 0x1fffffffe) !=
      0) {
    if (iterations != 0) {
      uVar8 = 1;
      do {
        iVar4 = (*progress->_vptr_Progress[8])(progress);
        if ((char)iVar4 != '\0') break;
        (*progress->_vptr_Progress[4])(progress,this,uVar8,(ulong)iterations,(ulong)window);
        reweight(this,(uint)uVar8);
        vcycle(this,window,0);
        FVar10 = cost(this);
        if (FVar10 < local_54) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&local_48,__x);
          local_54 = FVar10;
        }
        (*progress->_vptr_Progress[5])(local_54,progress,this);
        if (period != 0) {
          window = window + ((int)(uVar8 % (ulong)period) == 0);
        }
        uVar7 = (uint)uVar8 + 1;
        uVar8 = (ulong)uVar7;
      } while (uVar7 <= iterations);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(__x,&local_48);
    puVar3 = (this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = (int)((ulong)((long)(this->perm).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2);
    if (iVar4 != 0) {
      pNVar2 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar9 = 0.0;
      lVar6 = 0;
      do {
        uVar7 = puVar3[lVar6];
        fVar1 = pNVar2[uVar7].hlen;
        fVar9 = fVar9 + fVar1;
        pNVar2[uVar7].pos = fVar9;
        fVar9 = fVar9 + fVar1;
        lVar6 = lVar6 + 1;
      } while (iVar4 != (int)lVar6);
    }
  }
  (*progress->_vptr_Progress[3])(local_54,progress,this);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
Graph::order(Functional* functional, uint iterations, uint window, uint period, uint seed, Progress* progress)
{
  // Initialize graph.
  this->functional = functional;
  progress = this->progress = progress ? progress : new Progress;
  for (level = 0; (1u << level) < nodes(); level++);
  place();
  Float mincost = cost();
  vector<Node::Index> minperm = perm;
  if (seed)
    shuffle(seed);

  progress->beginorder(this, mincost);
  if (edges()) {
    // Perform specified number of V-cycles.
    for (uint k = 1; k <= iterations && !progress->quit(); k++) {
      progress->beginiter(this, k, iterations, window);
      reweight(k);
      vcycle(window);
      Float c = cost();
      if (c < mincost) { 
        mincost = c;
        minperm = perm;
      }
      progress->enditer(this, mincost, c);
      if (period && !(k % period))
        window++;
    }
    perm = minperm;
    place();
  }
  progress->endorder(this, mincost);

  if (!progress) {
    delete this->progress;
    this->progress = 0;
  }
}